

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O3

short * __thiscall
cubeb_resampler_speex_one_way<short>::output
          (cubeb_resampler_speex_one_way<short> *this,size_t output_frame_count,
          size_t *input_frames_used)

{
  size_t *psVar1;
  short *psVar2;
  uint uVar3;
  ulong uVar5;
  ulong uVar6;
  uint32_t in_len;
  uint32_t out_len;
  uint local_30;
  uint local_2c;
  ulong uVar4;
  
  uVar6 = (ulong)(this->super_processor).channels;
  if ((this->resampling_out_buffer).capacity_ < uVar6 * output_frame_count) {
    auto_array<short>::reserve(&this->resampling_out_buffer,uVar6 * output_frame_count);
    uVar6 = (ulong)(this->super_processor).channels;
  }
  local_30 = (uint)((this->resampling_in_buffer).length_ / uVar6);
  local_2c = (uint)output_frame_count;
  speex_resampler_process_interleaved_int
            (this->speex_resampler,(this->resampling_in_buffer).data_,&local_30,
             (this->resampling_out_buffer).data_,&local_2c);
  if (local_2c < output_frame_count) {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (1 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: underrun during resampling: got %u frames, expected %zu\n",
                 "cubeb_resampler_internal.h",0xf9,(ulong)local_2c,output_frame_count);
    }
    uVar3 = (this->super_processor).channels;
    uVar6 = (ulong)uVar3;
    uVar3 = local_2c * uVar3;
    uVar4 = (ulong)uVar3;
    uVar5 = output_frame_count * uVar6;
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      psVar2 = (this->resampling_out_buffer).data_;
      do {
        uVar3 = uVar3 + 1;
        psVar2[uVar4] = 0;
        uVar4 = (ulong)uVar3;
      } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
    }
  }
  else {
    uVar6 = (ulong)(this->super_processor).channels;
  }
  uVar5 = (ulong)local_30;
  uVar6 = uVar6 * uVar5;
  uVar4 = (this->resampling_in_buffer).length_;
  if (uVar6 <= uVar4) {
    psVar2 = (this->resampling_in_buffer).data_;
    memmove(psVar2,psVar2 + uVar6,(uVar4 - uVar6) * 2);
    psVar1 = &(this->resampling_in_buffer).length_;
    *psVar1 = *psVar1 - uVar6;
    uVar5 = (ulong)local_30;
  }
  *input_frames_used = uVar5;
  return (this->resampling_out_buffer).data_;
}

Assistant:

T * output(size_t output_frame_count, size_t * input_frames_used)
  {
    if (resampling_out_buffer.capacity() <
        frames_to_samples(output_frame_count)) {
      resampling_out_buffer.reserve(frames_to_samples(output_frame_count));
    }

    uint32_t in_len = samples_to_frames(resampling_in_buffer.length());
    uint32_t out_len = output_frame_count;

    speex_resample(resampling_in_buffer.data(), &in_len,
                   resampling_out_buffer.data(), &out_len);

    if (out_len < output_frame_count) {
      LOGV("underrun during resampling: got %u frames, expected %zu",
           (unsigned)out_len, output_frame_count);
      // silence the rightmost part
      T * data = resampling_out_buffer.data();
      for (uint32_t i = frames_to_samples(out_len);
           i < frames_to_samples(output_frame_count); i++) {
        data[i] = 0;
      }
    }

    /* This shifts back any unresampled samples to the beginning of the input
       buffer. */
    resampling_in_buffer.pop(nullptr, frames_to_samples(in_len));
    *input_frames_used = in_len;

    return resampling_out_buffer.data();
  }